

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O1

size_t defaultPrevCharLen(char *buf,size_t param_2,size_t pos,size_t *col_len)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  long lVar8;
  size_t unaff_R13;
  int end;
  uint uVar9;
  int cp;
  int local_3c;
  size_t local_38;
  
  local_38 = pos;
  do {
    if (pos == 0) {
      return 0;
    }
    uVar9 = (uint)pos;
    uVar4 = (int)uVar9 >> 0x1f & uVar9;
    if (0 < (int)uVar9) {
      uVar4 = uVar9;
    }
    sVar7 = (size_t)(int)(uVar9 - (uVar4 - 1));
    pos = pos - sVar7;
    sVar7 = utf8BytesToCodePoint(buf + pos,sVar7,&local_3c);
    uVar5 = (ulong)local_3c;
    uVar6 = 0;
    do {
      uVar1 = *(ulong *)((long)combiningCharTable + uVar6);
      bVar3 = ((byte)sVar7 | uVar1 == uVar5) & uVar1 <= uVar5;
      sVar7 = (size_t)bVar3;
      if (uVar5 <= uVar1) goto LAB_00133b5f;
      uVar6 = uVar6 + 8;
    } while (uVar6 != 0x3f20);
    bVar3 = 0;
LAB_00133b5f:
    if (bVar3 == 0) {
      if (col_len != (size_t *)0x0) {
        lVar8 = 8;
        do {
          uVar1 = *(ulong *)((long)combiningCharTable + lVar8 + 0x3f18);
          uVar2 = *(ulong *)((long)wideCharTable[0] + lVar8);
          uVar6 = (ulong)(((byte)uVar6 | uVar5 <= uVar2) & uVar1 <= uVar5);
          if ((uVar5 < uVar1) || (uVar5 <= uVar2)) goto LAB_00133ba3;
          lVar8 = lVar8 + 0x10;
        } while (lVar8 != 0x7a8);
        uVar6 = 0;
LAB_00133ba3:
        *col_len = uVar6 + 1;
      }
      unaff_R13 = local_38 - pos;
    }
    if (bVar3 == 0) {
      return unaff_R13;
    }
  } while( true );
}

Assistant:

static size_t defaultPrevCharLen(const char * buf, size_t /*buf_len*/, size_t pos, size_t * col_len) {
    size_t end = pos;
    while (pos > 0) {
        size_t len = prevUtf8CodePointLen(buf, pos);
        pos -= len;
        int cp;
        utf8BytesToCodePoint(buf + pos, len, &cp);
        if (!isCombiningChar(cp)) {
            if (col_len != NULL) {
                *col_len = isWideChar(cp) ? 2 : 1;
            }
            return end - pos;
        }
    }
    /* NOTREACHED */
    return 0;
}